

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media.h
# Opt level: O0

DDAMajorantIterator * __thiscall
pbrt::RGBGridMedium::SampleRay
          (RGBGridMedium *this,Ray *ray,Float raytMax,SampledWavelengths *lambda)

{
  Vector3f d;
  Point3f o;
  bool bVar1;
  undefined8 *in_RDX;
  DDAMajorantIterator *in_RDI;
  MajorantGrid *in_stack_00000048;
  Float in_stack_00000050;
  Float in_stack_00000054;
  Ray *in_stack_00000058;
  DDAMajorantIterator *in_stack_00000060;
  SampledSpectrum sigma_t;
  Float tMax;
  Float tMin;
  Float *in_stack_000000d8;
  Ray *in_stack_000000e0;
  DDAMajorantIterator *this_00;
  Float *in_stack_ffffffffffffff28;
  Float *in_stack_ffffffffffffff30;
  Float in_stack_ffffffffffffff3c;
  Bounds3<float> *in_stack_ffffffffffffff40;
  float in_stack_ffffffffffffff5c;
  undefined8 in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff7c;
  
  this_00 = in_RDI;
  Transform::ApplyInverse((Transform *)lambda,in_stack_000000e0,in_stack_000000d8);
  Ray::operator=((Ray *)this_00,(Ray *)in_RDI);
  o.super_Tuple3<pbrt::Point3,_float>.y = (float)in_stack_ffffffffffffff7c;
  o.super_Tuple3<pbrt::Point3,_float>.x = (float)*(undefined4 *)((long)in_RDX + 0x14);
  o.super_Tuple3<pbrt::Point3,_float>.z = (float)*in_RDX;
  d.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)in_stack_ffffffffffffff60;
  d.super_Tuple3<pbrt::Vector3,_float>.z = (float)(int)((ulong)in_stack_ffffffffffffff60 >> 0x20);
  d.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_ffffffffffffff5c;
  bVar1 = Bounds3<float>::IntersectP
                    (in_stack_ffffffffffffff40,o,d,in_stack_ffffffffffffff3c,
                     in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  if (bVar1) {
    SampledSpectrum::SampledSpectrum(&this_00->sigma_t,(Float)((ulong)in_RDI >> 0x20));
    Ray::Ray((Ray *)this_00,(Ray *)in_RDI);
    DDAMajorantIterator::DDAMajorantIterator
              (in_stack_00000060,in_stack_00000058,in_stack_00000054,in_stack_00000050,
               in_stack_00000048,sigma_t);
  }
  else {
    memset(in_RDI,0,0x60);
    DDAMajorantIterator::DDAMajorantIterator(this_00);
  }
  return this_00;
}

Assistant:

SampleRay(Ray ray, Float raytMax,
                                  const SampledWavelengths &lambda) const {
        // Transform ray to medium's space and compute bounds overlap
        ray = renderFromMedium.ApplyInverse(ray, &raytMax);
        Float tMin, tMax;
        if (!bounds.IntersectP(ray.o, ray.d, raytMax, &tMin, &tMax))
            return {};
        DCHECK_LE(tMax, raytMax);

        SampledSpectrum sigma_t(1);
        return DDAMajorantIterator(ray, tMin, tMax, &majorantGrid, sigma_t);
    }